

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_NtkInsertGroup(Cba_Ntk_t *p,Vec_Int_t *vObjs,Cba_Ntk_t *pSyn)

{
  int iVar1;
  int iVar2;
  int x;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int local_44;
  int local_40;
  int iFon;
  int iFin;
  int iObjNew;
  int iObj;
  int k;
  Vec_Int_t *vFonOuts;
  Vec_Int_t *vFonIns;
  Cba_Ntk_t *pSyn_local;
  Vec_Int_t *vObjs_local;
  Cba_Ntk_t *p_local;
  
  p_00 = Cba_NtkCollectInFons(p,vObjs);
  p_01 = Cba_NtkCollectOutFons(p,vObjs);
  iVar1 = Cba_NtkPiNum(pSyn);
  iVar2 = Vec_IntSize(p_00);
  if (iVar1 != iVar2) {
    __assert_fail("Cba_NtkPiNum(pSyn) == Vec_IntSize(vFonIns)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x45a,"void Cba_NtkInsertGroup(Cba_Ntk_t *, Vec_Int_t *, Cba_Ntk_t *)");
  }
  iVar1 = Cba_NtkPoNum(pSyn);
  iVar2 = Vec_IntSize(p_01);
  if (iVar1 == iVar2) {
    Cba_NtkCleanFonCopies(pSyn);
    for (iObjNew = 0; iVar1 = Cba_NtkPiNum(pSyn), iObjNew < iVar1; iObjNew = iObjNew + 1) {
      iVar1 = Cba_NtkPi(pSyn,iObjNew);
      iVar1 = Cba_ObjFon0(pSyn,iVar1);
      iVar2 = Vec_IntEntry(p_00,iObjNew);
      Cba_FonSetCopy(pSyn,iVar1,iVar2);
    }
    Vec_IntFree(p_00);
    Cba_NtkCleanObjCopies(pSyn);
    for (iFin = 1; iVar1 = Vec_StrSize(&pSyn->vObjType), iFin < iVar1; iFin = iFin + 1) {
      iVar1 = Cba_ObjIsBox(pSyn,iFin);
      if (iVar1 != 0) {
        iVar1 = Cba_ObjDup(p,pSyn,iFin);
        iObjNew = 0;
        for (local_44 = Cba_ObjFon0(pSyn,iFin); iVar2 = Cba_ObjFon0(pSyn,iFin + 1), local_44 < iVar2
            ; local_44 = local_44 + 1) {
          iVar2 = Cba_ObjFon(p,iVar1,iObjNew);
          Cba_FonSetCopy(pSyn,local_44,iVar2);
          iObjNew = iObjNew + 1;
        }
      }
    }
    for (iFin = 1; iVar1 = Vec_StrSize(&pSyn->vObjType), iFin < iVar1; iFin = iFin + 1) {
      iVar1 = Cba_ObjIsBox(pSyn,iFin);
      if (iVar1 != 0) {
        iVar1 = Cba_ObjCopy(pSyn,iFin);
        iObjNew = 0;
        for (local_40 = Cba_ObjFin0(pSyn,iFin); iVar2 = Cba_ObjFin0(pSyn,iFin + 1), local_40 < iVar2
            ; local_40 = local_40 + 1) {
          iVar2 = Cba_FinFon(pSyn,local_40);
          iVar2 = Cba_FonCopy(pSyn,iVar2);
          Cba_ObjSetFinFon(p,iVar1,iObjNew,iVar2);
          iObjNew = iObjNew + 1;
        }
      }
    }
    Cba_NtkCleanFonCopies(p);
    iVar1 = Cba_NtkHasFonNames(p);
    if (iVar1 != 0) {
      iVar1 = Cba_NtkFonNum(p);
      Vec_IntFillExtra(&p->vFonName,iVar1 + 1,0);
    }
    iObjNew = 0;
    while( true ) {
      iVar1 = Cba_NtkPoNum(pSyn);
      if (iVar1 <= iObjNew) {
        Vec_IntFree(p_01);
        for (local_40 = 1; iVar1 = Vec_IntSize(&p->vFinFon), local_40 < iVar1;
            local_40 = local_40 + 1) {
          iVar1 = Vec_IntEntry(&p->vFinFon,local_40);
          if (((iVar1 != 0) && (iVar2 = Cba_FonIsReal(iVar1), iVar2 != 0)) &&
             (iVar2 = Cba_FonCopy(p,iVar1), iVar2 != 0)) {
            iVar1 = Cba_FonCopy(p,iVar1);
            Cba_PatchFinFon(p,local_40,iVar1);
          }
        }
        Cba_NtkMissingFonNames(p,"j");
        return;
      }
      iVar1 = Cba_NtkPo(pSyn,iObjNew);
      iVar1 = Cba_ObjFinFon(pSyn,iVar1,0);
      iVar2 = Cba_FonCopy(pSyn,iVar1);
      iVar2 = Cba_FonIsReal(iVar2);
      if (iVar2 == 0) break;
      iVar2 = Vec_IntEntry(p_01,iObjNew);
      x = Cba_FonCopy(pSyn,iVar1);
      Cba_FonSetCopy(p,iVar2,x);
      iVar2 = Cba_NtkHasFonNames(p);
      if (iVar2 != 0) {
        iVar1 = Cba_FonCopy(pSyn,iVar1);
        iVar2 = Vec_IntEntry(p_01,iObjNew);
        iVar2 = Cba_FonName(p,iVar2);
        Cba_FonSetName(p,iVar1,iVar2);
        iVar1 = Vec_IntEntry(p_01,iObjNew);
        Cba_FonCleanName(p,iVar1);
      }
      iObjNew = iObjNew + 1;
    }
    __assert_fail("Cba_FonIsReal(Cba_FonCopy(pSyn, iFon))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x476,"void Cba_NtkInsertGroup(Cba_Ntk_t *, Vec_Int_t *, Cba_Ntk_t *)");
  }
  __assert_fail("Cba_NtkPoNum(pSyn) == Vec_IntSize(vFonOuts)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                ,0x45b,"void Cba_NtkInsertGroup(Cba_Ntk_t *, Vec_Int_t *, Cba_Ntk_t *)");
}

Assistant:

void Cba_NtkInsertGroup( Cba_Ntk_t * p, Vec_Int_t * vObjs, Cba_Ntk_t * pSyn )
{
    Vec_Int_t * vFonIns  = Cba_NtkCollectInFons( p, vObjs );
    Vec_Int_t * vFonOuts = Cba_NtkCollectOutFons( p, vObjs );
    int k, iObj, iObjNew, iFin, iFon;
    assert( Cba_NtkPiNum(pSyn) == Vec_IntSize(vFonIns) );
    assert( Cba_NtkPoNum(pSyn) == Vec_IntSize(vFonOuts) );
    // mark AIG with the input fons
    Cba_NtkCleanFonCopies( pSyn );
    Cba_NtkForEachPiFon( pSyn, iObj, iFon, k )
        Cba_FonSetCopy( pSyn, iFon, Vec_IntEntry(vFonIns, k) );
    Vec_IntFree( vFonIns );
    // build up internal nodes
    Cba_NtkCleanObjCopies( pSyn );
    Cba_NtkForEachBox( pSyn, iObj )
    {
        iObjNew = Cba_ObjDup( p, pSyn, iObj );
        Cba_ObjForEachFon( pSyn, iObj, iFon, k )
            Cba_FonSetCopy( pSyn, iFon, Cba_ObjFon(p, iObjNew, k) );
    }
    // connect internal nodes
    Cba_NtkForEachBox( pSyn, iObj )
    {
        iObjNew = Cba_ObjCopy( pSyn, iObj );
        Cba_ObjForEachFinFon( pSyn, iObj, iFin, iFon, k )
            Cba_ObjSetFinFon( p, iObjNew, k, Cba_FonCopy(pSyn, iFon) );
    }
    // connect output fons
    Cba_NtkCleanFonCopies( p );
    if ( Cba_NtkHasFonNames(p) )
        Vec_IntFillExtra( &p->vFonName, Cba_NtkFonNum(p) + 1, 0 );
    Cba_NtkForEachPoDriverFon( pSyn, iObj, iFon, k )
    {
        assert( Cba_FonIsReal(Cba_FonCopy(pSyn, iFon)) );
        Cba_FonSetCopy( p, Vec_IntEntry(vFonOuts, k), Cba_FonCopy(pSyn, iFon) );
        // transfer names
        if ( Cba_NtkHasFonNames(p) )
        {
            Cba_FonSetName( p, Cba_FonCopy(pSyn, iFon), Cba_FonName(p, Vec_IntEntry(vFonOuts, k)) );
            Cba_FonCleanName( p, Vec_IntEntry(vFonOuts, k) );
        }
    }
    Vec_IntFree( vFonOuts );
    // delete nodes
//    Vec_IntForEachEntry( vObjs, iObj, k )
//        Cba_ObjDelete( p, iObj );
    // update fins pointing to output fons to point to the new fons
    Cba_NtkForEachFinFon( p, iFon, iFin )
        if ( Cba_FonIsReal(iFon) && Cba_FonCopy(p, iFon) )
            Cba_PatchFinFon( p, iFin, Cba_FonCopy(p, iFon) );
    Cba_NtkMissingFonNames( p, "j" );
/*
    // duplicate in DFS order
    pNew = Cba_NtkDupOrder( p->pDesign, p, Cba_NtkCollectDfs );
    Cba_NtkDupAttrs( pNew, p );
    // replace "p" with "pNew"
    Cba_NtkUpdate( Cba_NtkMan(p), pNew ); // removes "p"
    return pNew;
*/
}